

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O0

void __thiscall Updater::onReply(Updater *this,QNetworkReply *reply)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QString local_330;
  QString local_318;
  QString local_300;
  QString local_2e8;
  QJsonValue local_2d0 [24];
  QString local_2b8;
  QString local_2a0;
  QJsonValue local_288 [24];
  QString local_270;
  QString local_258;
  QJsonValue local_240 [24];
  QString local_228;
  QString local_210;
  QJsonValue local_1f8 [24];
  QString local_1e0;
  QString local_1c8;
  QJsonValue local_1b0 [24];
  QString local_198;
  QString local_180;
  QJsonValue local_168 [24];
  QJsonObject local_150 [8];
  QJsonObject platform;
  QJsonObject local_130 [8];
  QJsonValue local_128 [24];
  QJsonObject local_110 [8];
  QJsonObject updates;
  QByteArray local_f0;
  undefined1 local_d8 [8];
  QJsonDocument document;
  QByteArray local_b8;
  QString local_a0;
  QString local_88;
  undefined4 local_70;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_6c;
  QString local_68;
  QVariant local_40 [32];
  QUrl local_20;
  QUrl redirect;
  QNetworkReply *reply_local;
  Updater *this_local;
  
  redirect.d = (QUrlPrivate *)reply;
  QNetworkReply::attribute((Attribute)local_40);
  QVariant::toUrl();
  QVariant::~QVariant(local_40);
  bVar1 = QUrl::isEmpty();
  if ((bVar1 & 1) == 0) {
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_6c,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags *)&local_68);
    setUrl(this,&local_68);
    QString::~QString(&local_68);
    checkForUpdates(this);
    local_70 = 1;
  }
  else {
    iVar3 = QNetworkReply::error();
    if (iVar3 == 0) {
      bVar2 = customAppcast(this);
      if (bVar2) {
        url(&local_a0,this);
        QIODevice::readAll();
        appcastDownloaded(this,&local_a0,&local_b8);
        QByteArray::~QByteArray(&local_b8);
        QString::~QString(&local_a0);
        url((QString *)&document,this);
        checkingFinished(this,(QString *)&document);
        QString::~QString((QString *)&document);
        local_70 = 1;
      }
      else {
        QIODevice::readAll();
        QJsonDocument::fromJson((QByteArray *)local_d8,(QJsonParseError *)&local_f0);
        QByteArray::~QByteArray(&local_f0);
        bVar1 = QJsonDocument::isNull();
        if ((bVar1 & 1) == 0) {
          QJsonDocument::object();
          QString::QString((QString *)&platform,"updates");
          QJsonObject::value((QString *)local_128);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue(local_128);
          QString::~QString((QString *)&platform);
          QJsonObject::~QJsonObject(local_130);
          platformKey(&local_180,this);
          QJsonObject::value((QString *)local_168);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue(local_168);
          QString::~QString(&local_180);
          QString::QString(&local_1c8,"open-url");
          QJsonObject::value((QString *)local_1b0);
          QJsonValue::toString();
          QString::operator=(&this->m_openUrl,&local_198);
          QString::~QString(&local_198);
          QJsonValue::~QJsonValue(local_1b0);
          QString::~QString(&local_1c8);
          QString::QString(&local_210,"changelog");
          QJsonObject::value((QString *)local_1f8);
          QJsonValue::toString();
          QString::operator=(&this->m_changelog,&local_1e0);
          QString::~QString(&local_1e0);
          QJsonValue::~QJsonValue(local_1f8);
          QString::~QString(&local_210);
          QString::QString(&local_258,"download-url");
          QJsonObject::value((QString *)local_240);
          QJsonValue::toString();
          QString::operator=(&this->m_downloadUrl,&local_228);
          QString::~QString(&local_228);
          QJsonValue::~QJsonValue(local_240);
          QString::~QString(&local_258);
          QString::QString(&local_2a0,"latest-version");
          QJsonObject::value((QString *)local_288);
          QJsonValue::toString();
          QString::operator=(&this->m_latestVersion,&local_270);
          QString::~QString(&local_270);
          QJsonValue::~QJsonValue(local_288);
          QString::~QString(&local_2a0);
          QString::QString(&local_2b8,"mandatory-update");
          bVar1 = QJsonObject::contains((QString *)local_150);
          QString::~QString(&local_2b8);
          if ((bVar1 & 1) != 0) {
            QString::QString(&local_2e8,"mandatory-update");
            QJsonObject::value((QString *)local_2d0);
            bVar1 = QJsonValue::toBool(SUB81(local_2d0,0));
            this->m_mandatoryUpdate = (bool)(bVar1 & 1);
            QJsonValue::~QJsonValue(local_2d0);
            QString::~QString(&local_2e8);
          }
          latestVersion(&local_300,this);
          moduleVersion(&local_318,this);
          bVar2 = compare(this,&local_300,&local_318);
          setUpdateAvailable(this,bVar2);
          QString::~QString(&local_318);
          QString::~QString(&local_300);
          url(&local_330,this);
          checkingFinished(this,&local_330);
          QString::~QString(&local_330);
          QJsonObject::~QJsonObject(local_150);
          QJsonObject::~QJsonObject(local_110);
          local_70 = 0;
        }
        else {
          setUpdateAvailable(this,false);
          url((QString *)&updates,this);
          checkingFinished(this,(QString *)&updates);
          QString::~QString((QString *)&updates);
          local_70 = 1;
        }
        QJsonDocument::~QJsonDocument((QJsonDocument *)local_d8);
      }
    }
    else {
      setUpdateAvailable(this,false);
      url(&local_88,this);
      checkingFinished(this,&local_88);
      QString::~QString(&local_88);
      local_70 = 1;
    }
  }
  QUrl::~QUrl(&local_20);
  return;
}

Assistant:

void Updater::onReply(QNetworkReply *reply)
{
   /* Check if we need to redirect */
   QUrl redirect = reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!redirect.isEmpty())
   {
      setUrl(redirect.toString());
      checkForUpdates();
      return;
   }

   /* There was a network error */
   if (reply->error() != QNetworkReply::NoError)
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* The application wants to interpret the appcast by itself */
   if (customAppcast())
   {
      emit appcastDownloaded(url(), reply->readAll());
      emit checkingFinished(url());
      return;
   }

   /* Try to create a JSON document from downloaded data */
   QJsonDocument document = QJsonDocument::fromJson(reply->readAll());

   /* JSON is invalid */
   if (document.isNull())
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* Get the platform information */
   QJsonObject updates = document.object().value("updates").toObject();
   QJsonObject platform = updates.value(platformKey()).toObject();

   /* Get update information */
   m_openUrl = platform.value("open-url").toString();
   m_changelog = platform.value("changelog").toString();
   m_downloadUrl = platform.value("download-url").toString();
   m_latestVersion = platform.value("latest-version").toString();
   if (platform.contains("mandatory-update"))
      m_mandatoryUpdate = platform.value("mandatory-update").toBool();

   /* Compare latest and current version */
   setUpdateAvailable(compare(latestVersion(), moduleVersion()));
   emit checkingFinished(url());
}